

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::RandomNumberGenerator::
     shuffle<std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
               (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *vector)

{
  iterator __first;
  iterator __last;
  RandomNumberGenerator local_11;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *pvStack_10;
  RandomNumberGenerator rng;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *vector_local;
  
  pvStack_10 = vector;
  __first = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin(vector);
  __last = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end(pvStack_10);
  std::
  shuffle<__gnu_cxx::__normal_iterator<Catch::TestCase*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>,Catch::RandomNumberGenerator&>
            ((__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              )__first._M_current,
             (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              )__last._M_current,&local_11);
  return;
}

Assistant:

static void shuffle( V& vector ) {
            RandomNumberGenerator rng;
#ifdef CATCH_CONFIG_CPP11_SHUFFLE
            std::shuffle( vector.begin(), vector.end(), rng );
#else
            std::random_shuffle( vector.begin(), vector.end(), rng );
#endif
        }